

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O3

uint32_t bcm2835_peri_read(uint32_t *paddr)

{
  uint32_t uVar1;
  
  if (debug == '\0') {
    uVar1 = *paddr;
  }
  else {
    uVar1 = 0;
    printf("bcm2835_peri_read  paddr %p\n");
  }
  return uVar1;
}

Assistant:

uint32_t bcm2835_peri_read(volatile uint32_t* paddr)
{
    uint32_t ret;
    if (debug)
    {
		printf("bcm2835_peri_read  paddr %p\n", (void *) paddr);
		return 0;
    }
    else
    {
       __sync_synchronize();
       ret = *paddr;
       __sync_synchronize();
       return ret;
    }
}